

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirSAVETAP(void)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *ftapname;
  bool bVar4;
  int local_c4;
  undefined1 local_c0 [4];
  int done;
  undefined4 local_9c;
  char *local_98;
  char *id;
  char *tlp;
  allocator<char> local_71;
  string local_70 [8];
  string fnaamh;
  path fnaam;
  int local_20;
  int param3;
  int param2;
  int length;
  int start;
  aint val;
  int headerType;
  bool realtapeMode;
  bool exec;
  
  if (pass != 3) {
    SkipParam(&lp);
    return;
  }
  val._3_1_ = 1;
  val._2_1_ = 0;
  start = -1;
  param2 = -1;
  param3 = -1;
  local_20 = -1;
  fnaam._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._4_4_ =
       -1;
  bVar4 = DeviceID == (char *)0x0;
  if (bVar4) {
    Error("SAVETAP only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
  }
  val._3_1_ = !bVar4;
  GetOutputFileName_abi_cxx11_((path *)((long)&fnaamh.field_2 + 8),&lp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"",&local_71);
  std::allocator<char>::~allocator(&local_71);
  bVar4 = anyComma(&lp);
  if (bVar4) {
    bVar4 = anyComma(&lp);
    if (bVar4) {
      Error("[SAVETAP] Syntax error. No parameters",bp,PASS3);
      local_9c = 1;
      goto LAB_0011276a;
    }
    id = lp;
    local_98 = GetID(&lp);
    if ((local_98 != (char *)0x0) && (sVar2 = strlen(local_98), sVar2 != 0)) {
      iVar1 = cmphstr(&local_98,"basic",false);
      if (iVar1 == 0) {
        iVar1 = cmphstr(&local_98,"numbers",false);
        if (iVar1 == 0) {
          iVar1 = cmphstr(&local_98,"chars",false);
          if (iVar1 == 0) {
            iVar1 = cmphstr(&local_98,"code",false);
            if (iVar1 == 0) {
              iVar1 = cmphstr(&local_98,"headless",false);
              if (iVar1 != 0) {
                start = 0xff;
                val._2_1_ = 1;
              }
            }
            else {
              start = 3;
              val._2_1_ = 1;
            }
          }
          else {
            start = 2;
            val._2_1_ = 1;
          }
        }
        else {
          start = 1;
          val._2_1_ = 1;
        }
      }
      else {
        start = 0;
        val._2_1_ = 1;
      }
    }
    if ((val._2_1_ & 1) != 0) {
      bVar4 = anyComma(&lp);
      if (bVar4) {
        if (start == 0xff) {
          bVar4 = anyComma(&lp);
          if (bVar4) {
            Error("[SAVETAP] Syntax error. Missing start address",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          iVar1 = ParseExpression(&lp,&length);
          if (iVar1 == 0) {
            Error("[SAVETAP] Syntax error",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          if (length < 0) {
            Error("[SAVETAP] Negative values are not allowed",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          if (0xffff < length) {
            Error("[SAVETAP] Values higher than FFFFh are not allowed",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          param2 = length;
          bVar4 = anyComma(&lp);
          if (bVar4) {
            iVar1 = ParseExpression(&lp,&length);
            if (iVar1 == 0) {
              Error("[SAVETAP] Syntax error",bp,PASS3);
              local_9c = 1;
              goto LAB_0011276a;
            }
            if (length < 0) {
              Error("[SAVETAP] Negative values are not allowed",bp,PASS3);
              local_9c = 1;
              goto LAB_0011276a;
            }
            if (0xffff < length) {
              Error("[SAVETAP] Values higher than FFFFh are not allowed",bp,PASS3);
              local_9c = 1;
              goto LAB_0011276a;
            }
            param3 = length;
          }
          bVar4 = anyComma(&lp);
          if (bVar4) {
            iVar1 = ParseExpression(&lp,&length);
            if (iVar1 == 0) {
              Error("[SAVETAP] Syntax error",bp,PASS3);
              local_9c = 1;
              goto LAB_0011276a;
            }
            if ((length < 0) || (0xff < length)) {
              Error("[SAVETAP] Invalid flag byte",bp,PASS3);
              local_9c = 1;
              goto LAB_0011276a;
            }
            fnaam._M_cmpts._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl._4_4_ = length;
          }
        }
        else {
          bVar4 = anyComma(&lp);
          if (bVar4) {
            Error("[SAVETAP] Syntax error. Missing tape block file name",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          GetDelimitedString_abi_cxx11_((string *)local_c0,&lp);
          std::__cxx11::string::operator=(local_70,(string *)local_c0);
          std::__cxx11::string::~string((string *)local_c0);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) != 0) {
            Error("[SAVETAP] Syntax error in tape file name",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          bVar4 = anyComma(&lp);
          if (((!bVar4) || (bVar4 = anyComma(&lp), bVar4)) ||
             (iVar1 = ParseExpression(&lp,&length), iVar1 == 0)) {
            Error("[SAVETAP] Syntax error. Missing start address",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          if (length < 0) {
            Error("[SAVETAP] Negative values are not allowed",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          if (0xffff < length) {
            Error("[SAVETAP] Values higher than FFFFh are not allowed",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          param2 = length;
          bVar4 = anyComma(&lp);
          if (((!bVar4) || (bVar4 = anyComma(&lp), bVar4)) ||
             (iVar1 = ParseExpression(&lp,&length), iVar1 == 0)) {
            Error("[SAVETAP] Syntax error. Missing block length",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          if (length < 0) {
            Error("[SAVETAP] Negative values are not allowed",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          if (0xffff < length) {
            Error("[SAVETAP] Values higher than FFFFh are not allowed",bp,PASS3);
            local_9c = 1;
            goto LAB_0011276a;
          }
          param3 = length;
          bVar4 = anyComma(&lp);
          if (bVar4) {
            iVar1 = ParseExpression(&lp,&length);
            if (iVar1 == 0) {
              Error("[SAVETAP] Syntax error",bp,IF_FIRST);
              local_9c = 1;
              goto LAB_0011276a;
            }
            if (length < 0) {
              Error("[SAVETAP] Negative values are not allowed",bp,PASS3);
              local_9c = 1;
              goto LAB_0011276a;
            }
            if (0xffff < length) {
              Error("[SAVETAP] Values more than FFFFh are not allowed",bp,PASS3);
              local_9c = 1;
              goto LAB_0011276a;
            }
            local_20 = length;
          }
          bVar4 = anyComma(&lp);
          if (bVar4) {
            iVar1 = ParseExpression(&lp,&length);
            if (iVar1 == 0) {
              Error("[SAVETAP] Syntax error",bp,IF_FIRST);
              local_9c = 1;
              goto LAB_0011276a;
            }
            if (length < 0) {
              Error("[SAVETAP] Negative values are not allowed",bp,PASS3);
              local_9c = 1;
              goto LAB_0011276a;
            }
            if (0xffff < length) {
              Error("[SAVETAP] Values more than FFFFh are not allowed",bp,PASS3);
              local_9c = 1;
              goto LAB_0011276a;
            }
            fnaam._M_cmpts._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl._4_4_ = length;
          }
        }
      }
      else {
        val._2_1_ = 0;
      }
    }
    if ((val._2_1_ & 1) == 0) {
      lp = id;
      IsLabelNotFound = false;
      iVar1 = ParseExpression(&lp,&length);
      if ((iVar1 == 0) || ((IsLabelNotFound & 1U) != 0)) {
        Error("[SAVETAP] Syntax error",bp,PASS3);
        local_9c = 1;
        goto LAB_0011276a;
      }
      if (length < 0) {
        Error("[SAVETAP] Negative values are not allowed",bp,PASS3);
        local_9c = 1;
        goto LAB_0011276a;
      }
      param2 = length;
    }
  }
  else {
    if (StartAddress < 0) {
      Error("[SAVETAP] Syntax error. No parameters",bp,PASS3);
      local_9c = 1;
      goto LAB_0011276a;
    }
    param2 = StartAddress;
  }
  iVar1 = start;
  if ((val._3_1_ & 1) != 0) {
    local_c4 = 0;
    if ((val._2_1_ & 1) == 0) {
      bVar4 = IsZXSpectrumDevice(DeviceID);
      if (bVar4) {
        local_c4 = TAP_SaveSnapshot((path *)((long)&fnaamh.field_2 + 8),(unsigned_short)param2);
      }
      else {
        Error("[SAVETAP snapshot] Device is not of ZX Spectrum type.",Device->ID,SUPPRESS);
      }
    }
    else {
      ftapname = (char *)std::__cxx11::string::c_str();
      local_c4 = TAP_SaveBlock((path *)((long)&fnaamh.field_2 + 8),(uchar)iVar1,ftapname,param2,
                               param3,local_20,
                               fnaam._M_cmpts._M_impl._M_t.
                               super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                               .
                               super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                               ._M_head_impl._4_4_);
    }
    if (local_c4 == 0) {
      Error("[SAVETAP] Error writing file",bp,IF_FIRST);
    }
  }
  local_9c = 0;
LAB_0011276a:
  std::__cxx11::string::~string(local_70);
  std::filesystem::__cxx11::path::~path((path *)((long)&fnaamh.field_2 + 8));
  return;
}

Assistant:

static void dirSAVETAP() {
	if (pass != LASTPASS) {
		SkipParam(lp);
		return;
	}

	bool exec = true, realtapeMode = false;
	int headerType = -1;
	aint val;
	int start = -1, length = -1, param2 = -1, param3 = -1;

	if (!DeviceID) {
		Error("SAVETAP only allowed in real device emulation mode (See DEVICE)");
		exec = false;
	}

	const std::filesystem::path fnaam = GetOutputFileName(lp);
	std::string fnaamh {""};
	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			char *tlp = lp;
			char *id;

			if ((id = GetID(lp)) && strlen(id) > 0) {
				if (cmphstr(id, "basic")) {
					headerType = BASIC;
					realtapeMode = true;
				} else if (cmphstr(id, "numbers")) {
					headerType = NUMBERS;
					realtapeMode = true;
				} else if (cmphstr(id, "chars")) {
					headerType = CHARS;
					realtapeMode = true;
				} else if (cmphstr(id, "code")) {
					headerType = CODE;
					realtapeMode = true;
				} else if (cmphstr(id, "headless")) {
					headerType = HEADLESS;
					realtapeMode = true;
				}
			}

			if (realtapeMode) {
				if (anyComma(lp)) {
					if (headerType == HEADLESS) {
						if (!anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							start = val;
						} else {
							Error("[SAVETAP] Syntax error. Missing start address", bp, PASS3); return;
						}
						if (anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							length = val;
						}
						if (anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0 || val > 255) {
								Error("[SAVETAP] Invalid flag byte", bp, PASS3); return;
							}
							param3 = val;
						}
					} else if (!anyComma(lp)) {
						fnaamh = GetDelimitedString(lp);
						if (fnaamh.empty()) {
							Error("[SAVETAP] Syntax error in tape file name", bp, PASS3);
							return;
						} else if (anyComma(lp) && !anyComma(lp) && ParseExpression(lp, val)) {
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							start = val;

							if (anyComma(lp) && !anyComma(lp) && ParseExpression(lp, val)) {
								if (val < 0) {
									Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
								} else if (val > 0xFFFF) {
									Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
								}
								length = val;

								if (anyComma(lp)) {
									if (!ParseExpression(lp, val)) {
										Error("[SAVETAP] Syntax error", bp, IF_FIRST); return;
									}
									if (val < 0) {
										Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
									} else if (val > 0xFFFF) {
										Error("[SAVETAP] Values more than FFFFh are not allowed", bp, PASS3); return;
									}
									param2 = val;
								}
								if (anyComma(lp)) {
									if (!ParseExpression(lp, val)) {
										Error("[SAVETAP] Syntax error", bp, IF_FIRST); return;
									}
									if (val < 0) {
										Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
									} else if (val > 0xFFFF) {
										Error("[SAVETAP] Values more than FFFFh are not allowed", bp, PASS3); return;
									}
									param3 = val;
								}
							} else {
								Error("[SAVETAP] Syntax error. Missing block length", bp, PASS3); return;
							}
						} else {
							Error("[SAVETAP] Syntax error. Missing start address", bp, PASS3); return;
						}
					} else {
						Error("[SAVETAP] Syntax error. Missing tape block file name", bp, PASS3); return;
					}
				} else {
					realtapeMode = false;
				}
			}
			if (!realtapeMode) {
				lp = tlp;
				IsLabelNotFound = false;
				if (!ParseExpression(lp, val) || IsLabelNotFound) {
					Error("[SAVETAP] Syntax error", bp, PASS3); return;
				}
				if (val < 0) {
					Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
				}
				start = val;
			}
		} else {
			Error("[SAVETAP] Syntax error. No parameters", bp, PASS3); return;
		}
	} else if (StartAddress < 0) {
		Error("[SAVETAP] Syntax error. No parameters", bp, PASS3); return;
	} else {
		start = StartAddress;
	}

	if (exec) {
		int done = 0;

		if (realtapeMode) {
			done = TAP_SaveBlock(fnaam, headerType, fnaamh.c_str(), start, length, param2, param3);
		} else {
			if (!IsZXSpectrumDevice(DeviceID)) {
				Error("[SAVETAP snapshot] Device is not of ZX Spectrum type.", Device->ID, SUPPRESS);
			} else {
				done = TAP_SaveSnapshot(fnaam, start);
			}
		}

		if (!done) {
			Error("[SAVETAP] Error writing file", bp, IF_FIRST);
		}
	}
}